

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDictionary.cpp
# Opt level: O2

bool IDictionary::isBaseType(string *str)

{
  size_type sVar1;
  iterator iVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1b2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1b1;
  allocator local_1b0;
  allocator local_1af;
  allocator local_1ae;
  allocator local_1ad;
  allocator local_1ac;
  allocator local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  size_type local_1a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  baseTypes;
  allocator local_170 [32];
  string tempStr;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&tempStr,"int",local_170);
  std::__cxx11::string::string(local_130,"float",&local_1a9);
  std::__cxx11::string::string(local_110,"double",&local_1aa);
  std::__cxx11::string::string(local_f0,"short",&local_1ab);
  std::__cxx11::string::string(local_d0,"unsigned",&local_1ac);
  std::__cxx11::string::string(local_b0,"struct",&local_1ad);
  std::__cxx11::string::string(local_90,"enum",&local_1ae);
  std::__cxx11::string::string(local_70,"char",&local_1af);
  std::__cxx11::string::string(local_50,"bool",&local_1b0);
  __l._M_len = 9;
  __l._M_array = &tempStr;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&baseTypes,__l,&local_1b1,&local_1b2);
  lVar5 = 0x100;
  do {
    std::__cxx11::string::~string(local_130 + lVar5 + -0x20);
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  sVar1 = str->_M_string_length;
  std::__cxx11::string::string((string *)&tempStr,(string *)str);
  lVar5 = 0;
  local_1a8 = sVar1;
  do {
    if ((int)sVar1 < lVar5) break;
    std::__cxx11::string::substr((ulong)local_170,(ulong)str);
    std::__cxx11::string::operator=((string *)&tempStr,(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&baseTypes._M_t,&tempStr);
    lVar5 = lVar5 + 1;
  } while ((_Rb_tree_header *)iVar2._M_node == &baseTypes._M_t._M_impl.super__Rb_tree_header);
  if (tempStr._M_string_length == 0) {
    bVar4 = false;
  }
  else {
    lVar5 = (long)((int)tempStr._M_string_length + 1);
    while (((bVar4 = (int)local_1a8 <= (int)lVar5, (int)lVar5 < (int)local_1a8 &&
            (uVar3 = (ulong)(byte)(str->_M_dataplus)._M_p[lVar5], uVar3 < 0x2b)) &&
           ((0x40100002600U >> (uVar3 & 0x3f) & 1) != 0))) {
      lVar5 = lVar5 + 1;
    }
  }
  std::__cxx11::string::~string((string *)&tempStr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&baseTypes._M_t);
  return bVar4;
}

Assistant:

bool IDictionary::isBaseType(std::string str) {
    std::set<std::string> baseTypes({"int","float","double","short","unsigned","struct","enum","char","bool"});
    int maxLen = str.length();
    std::string tempStr =str;

    for(int i=0;i<=maxLen;i++)
    {
        tempStr=str.substr(0,maxLen-i);
        if(baseTypes.find(tempStr)!=baseTypes.end())
            break;
    }
    if(tempStr.empty())
        return false;

    for(int i=tempStr.length()+1;i<maxLen;i++)
    {
        if(!(isBlankSep(str[i])||str[i]=='*'))
            return false;
    }
    return true;
}